

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

uint RDL_getNodesForRingsystem(RDL_data *data,uint idx,RDL_node **nodes)

{
  RDL_node *pRVar1;
  uint local_2c;
  uint node;
  uint i;
  RDL_node **nodes_local;
  uint idx_local;
  RDL_data *data_local;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    pRVar1 = (RDL_node *)malloc(4);
    *nodes = pRVar1;
    data_local._4_4_ = 0xffffffff;
  }
  else if (idx < data->bccGraphs->nof_bcc) {
    pRVar1 = (RDL_node *)malloc((ulong)data->bccGraphs->bcc_graphs[idx]->V << 3);
    *nodes = pRVar1;
    for (local_2c = 0; local_2c < data->bccGraphs->bcc_graphs[idx]->V; local_2c = local_2c + 1) {
      (*nodes)[local_2c] = data->bccGraphs->node_from_bcc_mapping[idx][local_2c];
    }
    data_local._4_4_ = data->bccGraphs->bcc_graphs[idx]->V;
  }
  else {
    (*RDL_outputFunc)(RDL_ERROR,"idx %d is out of range!\n",(ulong)idx);
    pRVar1 = (RDL_node *)malloc(4);
    *nodes = pRVar1;
    data_local._4_4_ = 0xffffffff;
  }
  return data_local._4_4_;
}

Assistant:

unsigned RDL_getNodesForRingsystem(
    const RDL_data *data, unsigned idx, RDL_node** nodes)
{
  unsigned i, node;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*nodes) = malloc(sizeof(**nodes));
    return RDL_INVALID_RESULT;
  }

  if(idx >= data->bccGraphs->nof_bcc) {
    RDL_outputFunc(RDL_ERROR, "idx %d is out of range!\n", idx);
    (*nodes) = malloc(sizeof(**nodes));
    return RDL_INVALID_RESULT;
  }

  (*nodes) = malloc(data->bccGraphs->bcc_graphs[idx]->V * sizeof(*nodes));

  for (i = 0; i < data->bccGraphs->bcc_graphs[idx]->V; ++i) {
    node = data->bccGraphs->node_from_bcc_mapping[idx][i];
    (*nodes)[i] = node;
  }

  return data->bccGraphs->bcc_graphs[idx]->V;
}